

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O3

void NearLossless(int xsize,int ysize,uint32_t *argb_src,int stride,int limit_bits,
                 uint32_t *copy_buffer,uint32_t *argb_dst)

{
  size_t __n;
  bool bVar1;
  uint32_t *puVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint32_t *__dest;
  uint uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  uint32_t *local_98;
  uint32_t *local_88;
  
  iVar17 = 1 << ((byte)limit_bits & 0x1f);
  lVar4 = (long)xsize;
  local_88 = copy_buffer + lVar4;
  __n = lVar4 * 4;
  memcpy(local_88,argb_src,__n);
  memcpy(local_88 + lVar4,argb_src + stride,__n);
  if (0 < ysize) {
    local_98 = argb_dst;
    uVar3 = xsize - 1;
    iVar16 = -iVar17;
    uVar10 = -1 << ((byte)limit_bits & 0x1f);
    uVar15 = ~uVar10 >> 1;
    iVar9 = 0;
    puVar2 = local_88 + lVar4;
    do {
      __dest = puVar2;
      if (iVar9 == ysize + -1 || iVar9 == 0) {
        memcpy(local_98,argb_src,__n);
      }
      else {
        memcpy(__dest,argb_src + stride,__n);
        *local_98 = *argb_src;
        local_98[(int)uVar3] = argb_src[(int)uVar3];
        if (2 < xsize) {
          uVar5 = 1;
          do {
            uVar8 = local_88[uVar5];
            iVar6 = 0;
            do {
              iVar12 = (uVar8 >> ((byte)iVar6 & 0x1f) & 0xff) -
                       (local_88[uVar5 - 1] >> ((byte)iVar6 & 0x1f) & 0xff);
              if ((iVar17 <= iVar12) ||
                 (iVar12 == iVar16 || SBORROW4(iVar12,iVar16) != iVar12 + iVar17 < 0))
              goto LAB_0017855a;
              iVar6 = iVar6 + 8;
            } while (iVar6 != 0x20);
            iVar6 = 0;
            do {
              iVar12 = (uVar8 >> ((byte)iVar6 & 0x1f) & 0xff) -
                       (local_88[uVar5 + 1] >> ((byte)iVar6 & 0x1f) & 0xff);
              if ((iVar17 <= iVar12) ||
                 (iVar12 == iVar16 || SBORROW4(iVar12,iVar16) != iVar12 + iVar17 < 0))
              goto LAB_0017855a;
              iVar6 = iVar6 + 8;
            } while (iVar6 != 0x20);
            iVar6 = 0;
            do {
              iVar12 = (uVar8 >> ((byte)iVar6 & 0x1f) & 0xff) -
                       (copy_buffer[uVar5] >> ((byte)iVar6 & 0x1f) & 0xff);
              if ((iVar17 <= iVar12) ||
                 (iVar12 == iVar16 || SBORROW4(iVar12,iVar16) != iVar12 + iVar17 < 0))
              goto LAB_0017855a;
              iVar6 = iVar6 + 8;
            } while (iVar6 != 0x20);
            iVar6 = 0;
            do {
              iVar12 = (uVar8 >> ((byte)iVar6 & 0x1f) & 0xff) -
                       (__dest[uVar5] >> ((byte)iVar6 & 0x1f) & 0xff);
              bVar1 = SBORROW4(iVar12,iVar16) != iVar12 + iVar17 < 0;
              if ((iVar12 == iVar16 || bVar1) || iVar17 <= iVar12) break;
              bVar18 = iVar6 != 0x18;
              iVar6 = iVar6 + 8;
            } while (bVar18);
            if ((iVar12 == iVar16 || bVar1) || iVar17 <= iVar12) {
LAB_0017855a:
              uVar11 = (uVar8 >> 0x18) + uVar15 +
                       (uint)(((uVar8 >> 0x18) >> (limit_bits & 0x1fU) & 1) != 0);
              uVar7 = (uVar11 & uVar10) << 0x18;
              if (0xff < uVar11) {
                uVar7 = 0xff000000;
              }
              uVar11 = uVar8 >> 0x10 & 0xff;
              uVar13 = uVar11 + uVar15 + (uint)((uVar11 >> (limit_bits & 0x1fU) & 1) != 0);
              uVar11 = (uVar13 & uVar10) << 0x10;
              if (0xff < uVar13) {
                uVar11 = 0xff0000;
              }
              uVar13 = uVar8 >> 8 & 0xff;
              uVar14 = uVar13 + uVar15 + (uint)((uVar13 >> (limit_bits & 0x1fU) & 1) != 0);
              uVar13 = (uVar14 & uVar10) << 8;
              if (0xff < uVar14) {
                uVar13 = 0xff00;
              }
              uVar8 = (uVar8 & 0xff) + uVar15 +
                      (uint)(((uVar8 & 0xff) >> (limit_bits & 0x1fU) & 1) != 0);
              uVar14 = uVar8 & uVar10;
              if (0xff < uVar8) {
                uVar14 = 0xff;
              }
              uVar8 = uVar14 | uVar7 | uVar11 | uVar13;
            }
            local_98[uVar5] = uVar8;
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar3);
        }
      }
      iVar9 = iVar9 + 1;
      argb_src = argb_src + stride;
      local_98 = local_98 + lVar4;
      puVar2 = copy_buffer;
      copy_buffer = local_88;
      local_88 = __dest;
    } while (iVar9 != ysize);
  }
  return;
}

Assistant:

static void NearLossless(int xsize, int ysize, const uint32_t* argb_src,
                         int stride, int limit_bits, uint32_t* copy_buffer,
                         uint32_t* argb_dst) {
  int x, y;
  const int limit = 1 << limit_bits;
  uint32_t* prev_row = copy_buffer;
  uint32_t* curr_row = prev_row + xsize;
  uint32_t* next_row = curr_row + xsize;
  memcpy(curr_row, argb_src, xsize * sizeof(argb_src[0]));
  memcpy(next_row, argb_src + stride, xsize * sizeof(argb_src[0]));

  for (y = 0; y < ysize; ++y, argb_src += stride, argb_dst += xsize) {
    if (y == 0 || y == ysize - 1) {
      memcpy(argb_dst, argb_src, xsize * sizeof(argb_src[0]));
    } else {
      memcpy(next_row, argb_src + stride, xsize * sizeof(argb_src[0]));
      argb_dst[0] = argb_src[0];
      argb_dst[xsize - 1] = argb_src[xsize - 1];
      for (x = 1; x < xsize - 1; ++x) {
        if (IsSmooth(prev_row, curr_row, next_row, x, limit)) {
          argb_dst[x] = curr_row[x];
        } else {
          argb_dst[x] = ClosestDiscretizedArgb(curr_row[x], limit_bits);
        }
      }
    }
    {
      // Three-way swap.
      uint32_t* const temp = prev_row;
      prev_row = curr_row;
      curr_row = next_row;
      next_row = temp;
    }
  }
}